

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void ImFontGlyphRangesBuilder_SetBit(ImFontGlyphRangesBuilder *self,int n)

{
  uint *puVar1;
  
  if (n >> 5 < (self->UsedChars).Size) {
    puVar1 = (self->UsedChars).Data + (n >> 5);
    *puVar1 = *puVar1 | 1 << ((byte)n & 0x1f);
    return;
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4d8,"T &ImVector<unsigned int>::operator[](int) [T = unsigned int]");
}

Assistant:

inline bool     GetBit(int n) const { int off = (n >> 5); ImU32 mask = 1u << (n & 31); return (UsedChars[off] & mask) != 0; }